

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O0

bool density_tests::detail::
     PutTestObject<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>,_2048UL,_2048UL>
     ::put(conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
           *queue,EasyRandom *i_rand)

{
  EasyRandom *this;
  sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
  *this_00;
  TestObject<2048UL,_2048UL> *i_source;
  sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  *this_01;
  int32_t iVar1;
  ulong uVar2;
  undefined8 in_RSI;
  undefined8 in_RDI;
  ElementType source;
  TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>
  type;
  
  uVar2 = (ulong)&stack0xfffffffffffffff8 & 0xfffffffffffff800;
  *(undefined8 *)(uVar2 - 0x18) = in_RDI;
  *(undefined8 *)(uVar2 - 0x20) = in_RSI;
  this = *(EasyRandom **)(uVar2 - 0x20);
  *(undefined8 *)(uVar2 - 0x2808) = 0x28aae87;
  iVar1 = EasyRandom::get_bool(this,0.9);
  if (iVar1 == 0) {
    *(undefined8 *)(uVar2 - 0x2808) = 0x28aaf0d;
    TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>
    ::make<density_tests::TestObject<2048ul,2048ul>>();
    *(undefined8 *)(uVar2 - 0x2808) = 0x28aaf1a;
    TestObject<2048UL,_2048UL>::TestObject((TestObject<2048UL,_2048UL> *)(uVar2 - 0x2000));
    this_01 = *(sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                **)(uVar2 - 0x18);
    *(undefined8 *)(uVar2 - 0x2808) = 0x28aaf39;
    density::
    sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::dyn_push_copy(this_01,(runtime_type *)(uVar2 - 0x1018),(void *)(uVar2 - 0x2000));
    *(undefined8 *)(uVar2 - 0x2808) = 0x28aaf48;
    TestObject<2048UL,_2048UL>::~TestObject((TestObject<2048UL,_2048UL> *)(uVar2 - 0x2000));
    *(undefined8 *)(uVar2 - 0x2808) = 0x28aaf55;
    TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>
    ::~TestRuntimeTime((TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>
                        *)(uVar2 - 0x1018));
  }
  else {
    *(undefined8 *)(uVar2 - 0x2010) = *(undefined8 *)(uVar2 - 0x18);
    *(TestObject<2048UL,_2048UL> **)(uVar2 - 0x2008) =
         (TestObject<2048UL,_2048UL> *)(uVar2 - 0x1000);
    *(undefined8 *)(uVar2 - 0x2808) = 0x28aaeb1;
    TestObject<2048UL,_2048UL>::TestObject((TestObject<2048UL,_2048UL> *)(uVar2 - 0x1000));
    this_00 = *(sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
                **)(uVar2 - 0x2010);
    i_source = *(TestObject<2048UL,_2048UL> **)(uVar2 - 0x2008);
    *(undefined8 *)(uVar2 - 0x2808) = 0x28aaec6;
    density::
    sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
    ::push<density_tests::TestObject<2048ul,2048ul>>(this_00,i_source);
    *(undefined8 *)(uVar2 - 0x2808) = 0x28aaed5;
    TestObject<2048UL,_2048UL>::~TestObject((TestObject<2048UL,_2048UL> *)(uVar2 - 0x1000));
  }
  return true;
}

Assistant:

static bool put(QUEUE & queue, EasyRandom & i_rand)
            {
                if (i_rand.get_bool(.9))
                {
                    queue.push(ElementType());
                }
                else
                {
                    auto        type = QUEUE::runtime_type::template make<ElementType>();
                    ElementType source;
                    queue.dyn_push_copy(type, &source);
                }
                return true;
            }